

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O0

void absl::lts_20250127::cord_internal::CordRepBtree::Rebuild
               (CordRepBtree **stack,CordRepBtree *tree,bool consume)

{
  size_t delta;
  long *plVar1;
  int iVar2;
  iterator ppCVar3;
  CordRepBtree *pCVar4;
  CordRepBtree *tree_00;
  OpResult OVar5;
  bool local_b9;
  CordRep *rep;
  iterator __end3_1;
  iterator __begin3_1;
  Span<absl::lts_20250127::cord_internal::CordRep_*const> *local_90;
  Span<absl::lts_20250127::cord_internal::CordRep_*const> *__range3_1;
  Action local_80;
  undefined4 uStack_7c;
  CordRepBtree *local_78;
  OpResult result;
  CordRepBtree *node;
  size_t length;
  size_t height;
  CordRep *edge;
  iterator __end3;
  iterator __begin3;
  Span<absl::lts_20250127::cord_internal::CordRep_*const> *local_28;
  Span<absl::lts_20250127::cord_internal::CordRep_*const> *__range3;
  bool owned;
  CordRepBtree *pCStack_18;
  bool consume_local;
  CordRepBtree *tree_local;
  CordRepBtree **stack_local;
  
  local_b9 = false;
  __range3._7_1_ = consume;
  pCStack_18 = tree;
  tree_local = (CordRepBtree *)stack;
  if (consume) {
    local_b9 = RefcountAndFlags::IsOne(&(tree->super_CordRep).refcount);
  }
  __range3._6_1_ = local_b9;
  iVar2 = CordRepBtree::height(pCStack_18);
  if (iVar2 == 0) {
    ___begin3 = Edges(pCStack_18);
    local_28 = (Span<absl::lts_20250127::cord_internal::CordRep_*const> *)&__begin3;
    __end3 = Span<absl::lts_20250127::cord_internal::CordRep_*const>::begin(local_28);
    ppCVar3 = Span<absl::lts_20250127::cord_internal::CordRep_*const>::end(local_28);
    for (; __end3 != ppCVar3; __end3 = __end3 + 1) {
      height = (size_t)*__end3;
      if ((__range3._6_1_ & 1) == 0) {
        height = (size_t)CordRep::Ref((CordRep *)height);
      }
      length = 0;
      delta = *(size_t *)height;
      result._8_8_ = (tree_local->super_CordRep).length;
      OVar5 = AddEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                        ((CordRepBtree *)result._8_8_,true,(CordRep *)height,delta);
      local_78 = OVar5.tree;
      result.tree = (CordRepBtree *)CONCAT44(result.tree._4_4_,OVar5.action);
      while ((int)result.tree == 2) {
        *(CordRepBtree **)((tree_local->super_CordRep).storage + length * 8 + -0xd) = local_78;
        if (*(long *)((tree_local->super_CordRep).storage + length * 8 + -5) == 0) {
          result.tree = (CordRepBtree *)((ulong)result.tree & 0xffffffff00000000);
          pCVar4 = New((CordRepBtree *)result._8_8_,local_78);
          *(CordRepBtree **)((tree_local->super_CordRep).storage + length * 8 + -5) = pCVar4;
          length = length + 1;
        }
        else {
          result._8_8_ = *(undefined8 *)((tree_local->super_CordRep).storage + length * 8 + -5);
          OVar5 = AddEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                            ((CordRepBtree *)result._8_8_,true,&local_78->super_CordRep,delta);
          __range3_1 = (Span<absl::lts_20250127::cord_internal::CordRep_*const> *)OVar5.tree;
          local_80 = OVar5.action;
          result.tree = (CordRepBtree *)CONCAT44(uStack_7c,local_80);
          local_78 = (CordRepBtree *)__range3_1;
          length = length + 1;
        }
      }
      while (*(long *)((tree_local->super_CordRep).storage + length * 8 + -5) != 0) {
        plVar1 = *(long **)((tree_local->super_CordRep).storage + length * 8 + -5);
        *plVar1 = delta + *plVar1;
        length = length + 1;
      }
    }
  }
  else {
    ___begin3_1 = Edges(pCStack_18);
    local_90 = (Span<absl::lts_20250127::cord_internal::CordRep_*const> *)&__begin3_1;
    __end3_1 = Span<absl::lts_20250127::cord_internal::CordRep_*const>::begin(local_90);
    ppCVar3 = Span<absl::lts_20250127::cord_internal::CordRep_*const>::end(local_90);
    for (; pCVar4 = tree_local, __end3_1 != ppCVar3; __end3_1 = __end3_1 + 1) {
      tree_00 = CordRep::btree(*__end3_1);
      Rebuild((CordRepBtree **)pCVar4,tree_00,(bool)(__range3._6_1_ & 1));
    }
  }
  if ((__range3._7_1_ & 1) != 0) {
    if ((__range3._6_1_ & 1) == 0) {
      CordRep::Unref(&pCStack_18->super_CordRep);
    }
    else {
      Delete(pCStack_18);
    }
  }
  return;
}

Assistant:

void CordRepBtree::Rebuild(CordRepBtree** stack, CordRepBtree* tree,
                           bool consume) {
  bool owned = consume && tree->refcount.IsOne();
  if (tree->height() == 0) {
    for (CordRep* edge : tree->Edges()) {
      if (!owned) edge = CordRep::Ref(edge);
      size_t height = 0;
      size_t length = edge->length;
      CordRepBtree* node = stack[0];
      OpResult result = node->AddEdge<kBack>(true, edge, length);
      while (result.action == CordRepBtree::kPopped) {
        stack[height] = result.tree;
        if (stack[++height] == nullptr) {
          result.action = CordRepBtree::kSelf;
          stack[height] = CordRepBtree::New(node, result.tree);
        } else {
          node = stack[height];
          result = node->AddEdge<kBack>(true, result.tree, length);
        }
      }
      while (stack[++height] != nullptr) {
        stack[height]->length += length;
      }
    }
  } else {
    for (CordRep* rep : tree->Edges()) {
      Rebuild(stack, rep->btree(), owned);
    }
  }
  if (consume) {
    if (owned) {
      CordRepBtree::Delete(tree);
    } else {
      CordRepBtree::Unref(tree);
    }
  }
}